

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  unsigned_short **ppuVar1;
  unsigned_short *h;
  unsigned_short *h_00;
  pointer *ppuVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  value_type vVar5;
  undefined2 uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined4 uVar9;
  char *__s;
  undefined8 uVar10;
  unsigned_short *puVar11;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer __position;
  pointer pPVar12;
  _Alloc_hider _Var13;
  pointer *ppuVar14;
  int i_2;
  int iVar15;
  FP32 FVar16;
  uint uVar17;
  long lVar18;
  size_t sVar19;
  reference pvVar20;
  ushort *puVar21;
  reference pvVar22;
  mz_ulong mVar23;
  reference pvVar24;
  reference pvVar25;
  value_type *pvVar26;
  pointer *ppuVar27;
  int *piVar28;
  uint *puVar29;
  reference __first_00;
  reference pvVar30;
  uchar *__dest;
  sbyte sVar31;
  value_type vVar32;
  unsigned_short uVar33;
  int i;
  uint uVar34;
  uint uVar35;
  pointer puVar36;
  _Iter_comp_val<(anonymous_namespace)::FHeapCompare> *p_Var37;
  ushort uVar38;
  ushort uVar39;
  ulong uVar40;
  ulong uVar41;
  int y;
  int iVar42;
  int iVar43;
  FP16 h_01;
  uint uVar44;
  size_type __n;
  reference pvVar45;
  ushort *__dest_00;
  size_t __n_00;
  int x_4;
  int iVar46;
  uint uVar47;
  ulong uVar48;
  short sVar49;
  uint uVar50;
  unsigned_long uVar51;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  short bs;
  uint uVar52;
  _Iter_comp_val<(anonymous_namespace)::FHeapCompare> *p_Var53;
  int iVar54;
  long lVar55;
  int x_2;
  pointer paVar56;
  int *piVar57;
  unsigned_short **ppuVar58;
  pointer pPVar59;
  pointer paVar60;
  ulong uVar61;
  long lVar62;
  int x;
  long lVar63;
  reference pvVar64;
  uchar **data_00;
  ushort *puVar65;
  ushort *puVar66;
  ulong uVar67;
  bool bVar68;
  int iVar69;
  unsigned_short uVar70;
  uchar *b;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  channelData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  uchar bitmap [8192];
  char header [4];
  int hlink [65537];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  longlong c;
  unsigned_short auStack_20038 [65540];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_01;
  
  if ((memory_out == (uchar **)0x0 || exrImage == (EXRImage *)0x0) ||
     (4 < (uint)exrImage->compression)) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    __n_00 = 0;
  }
  else {
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,(const_iterator)0x0,
               header,&stack0xffffffffffe1ff8c);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               (const_iterator)
               memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,header,&stack0xffffffffffe1ff8c);
    iVar69 = exrImage->compression;
    iVar42 = 1;
    if (iVar69 == 4) {
      iVar42 = 0x20;
    }
    iVar15 = 0x10;
    if (iVar69 != 3) {
      iVar15 = iVar42;
    }
    channels.
    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    channels.
    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    channels.
    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar62 = 0;
        paVar60 = channels.
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar62 < exrImage->num_channels;
        lVar62 = lVar62 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&c,exrImage->channel_names[lVar62],(allocator<char> *)hlink);
      std::__cxx11::string::operator=((string *)header,(string *)&c);
      std::__cxx11::string::~string((string *)&c);
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back(&channels,(value_type *)header);
      std::__cxx11::string::~string((string *)header);
    }
    lVar18 = ((long)channels.
                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)channels.
                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    lVar63 = 0;
    paVar56 = channels.
              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar62 = lVar18;
    while (bVar68 = lVar62 != 0, lVar62 = lVar62 + -1, bVar68) {
      sVar19 = strlen((paVar56->name)._M_dataplus._M_p);
      lVar63 = lVar63 + sVar19 + 0x11;
      paVar56 = paVar56 + 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&data_1,lVar63 + 1);
    pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data_1,0);
    while (bVar68 = lVar18 != 0, lVar18 = lVar18 + -1, bVar68) {
      __s = (paVar60->name)._M_dataplus._M_p;
      sVar19 = strlen(__s);
      memcpy(pvVar20,__s,sVar19);
      sVar19 = strlen((paVar60->name)._M_dataplus._M_p);
      pvVar64 = pvVar20 + sVar19;
      pvVar20 = pvVar64 + 0x11;
      *pvVar64 = '\0';
      uVar10 = *(undefined8 *)&paVar60->xSampling;
      *(int *)(pvVar64 + 1) = paVar60->pixelType;
      pvVar64[5] = paVar60->pLinear;
      *(undefined8 *)(pvVar64 + 9) = uVar10;
      paVar60 = paVar60 + 1;
    }
    *pvVar20 = '\0';
    pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data_1,0);
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"channels","chlist",pvVar20,
               (int)data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_finish -
               (int)data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"compression","compression",(uchar *)header,1);
    uVar3 = exrImage->width;
    uVar4 = exrImage->height;
    __last._M_current._4_4_ = uVar4 + -1;
    __last._M_current._0_4_ = uVar3 + -1;
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"dataWindow","box2i",(uchar *)header,0x10);
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"displayWindow","box2i",(uchar *)header,0x10);
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"lineOrder","lineOrder",(uchar *)header,1);
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"pixelAspectRatio","float",(uchar *)header,4);
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"screenWindowCenter","v2f",(uchar *)header,8);
    __first_01._M_current._4_4_ = 0;
    header = (char  [4])(float)exrImage->width;
    anon_unknown.dwarf_13f3f::WriteAttributeToMemory
              (&memory,"screenWindowWidth","float",(uchar *)header,4);
    iVar42 = exrImage->num_custom_attributes;
    if (0 < iVar42) {
      data_00 = &exrImage->custom_attributes[0].value;
      for (lVar62 = 0; lVar62 < iVar42; lVar62 = lVar62 + 1) {
        anon_unknown.dwarf_13f3f::WriteAttributeToMemory
                  (&memory,((EXRAttribute *)(data_00 + -3))->name,(char *)data_00[-2],
                   (uchar *)data_00,*(int *)(data_00 + -1));
        iVar42 = exrImage->num_custom_attributes;
        data_00 = data_00 + 4;
      }
    }
    __first_01._M_current = __first_01._M_current & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&memory,(value_type_conflict1 *)header);
    iVar15 = exrImage->height / iVar15;
    sVar31 = (iVar69 == 4) * '\x05';
    if (iVar69 == 3) {
      sVar31 = 4;
    }
    uVar34 = (uint)(iVar15 << sVar31 < exrImage->height) + iVar15;
    __n = (size_type)(int)uVar34;
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&offsets,__n,(allocator_type *)header);
    puVar36 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              (__n * 8 -
              (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector(&dataList,__n,(allocator_type *)header);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&channelOffsetList,(long)exrImage->num_channels,(allocator_type *)header);
    uVar40 = 0;
    uVar67 = (ulong)(uint)exrImage->num_channels;
    if (exrImage->num_channels < 1) {
      uVar67 = uVar40;
    }
    uVar51 = 0;
    iVar69 = 0;
    for (; uVar67 != uVar40; uVar40 = uVar40 + 1) {
      channelOffsetList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar40] = uVar51;
      iVar42 = exrImage->requested_pixel_types[uVar40];
      if ((iVar42 == 0) || (iVar42 == 2)) {
        iVar69 = iVar69 + 4;
        uVar51 = uVar51 + 4;
      }
      else if (iVar42 == 1) {
        iVar69 = iVar69 + 2;
        uVar51 = uVar51 + 2;
      }
    }
    if ((int)uVar34 < 1) {
      uVar34 = 0;
    }
    uVar67 = 0;
LAB_001135ce:
    if (uVar67 != uVar34) {
      iVar15 = (int)uVar67 << sVar31;
      iVar42 = (int)(uVar67 + 1) << sVar31;
      if (exrImage->height < iVar42) {
        iVar42 = exrImage->height;
      }
      iVar42 = iVar42 - iVar15;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&buf,(long)(iVar42 * iVar69 * exrImage->width),(allocator_type *)header);
      iVar54 = 0;
      if (0 < iVar42) {
        iVar54 = iVar42;
      }
      for (lVar62 = 0; lVar62 < exrImage->num_channels; lVar62 = lVar62 + 1) {
        iVar43 = exrImage->pixel_types[lVar62];
        if (iVar43 == 2) {
          if (exrImage->requested_pixel_types[lVar62] == 1) {
            iVar43 = iVar15;
            for (iVar46 = 0; iVar46 != iVar54; iVar46 = iVar46 + 1) {
              lVar18 = 0;
              while( true ) {
                lVar63 = (long)exrImage->width;
                if (lVar63 <= lVar18) break;
                uVar47 = *(uint *)(exrImage->images[lVar62] +
                                  (long)(iVar43 * exrImage->width + (int)lVar18) * 4);
                uVar35 = uVar47 >> 0x17;
                uVar44 = uVar35 & 0xff;
                uVar38 = (ushort)uVar44;
                if ((char)uVar35 != '\0') {
                  if (uVar44 == 0xff) {
                    uVar38 = ((uVar47 & 0x7fffff) != 0 | 0x3e) << 9;
                  }
                  else {
                    uVar38 = 0x7c00;
                    if (uVar44 < 0x8f) {
                      if (uVar44 < 0x71) {
                        uVar38 = 0;
                        if (uVar44 < 0x66) goto LAB_001139ac;
                        uVar50 = uVar47 & 0x7fffff | 0x800000;
                        uVar38 = (ushort)(uVar50 >> (0x7eU - (char)uVar35 & 0x1f));
                        uVar50 = uVar50 >> (0x7d - uVar44 & 0x1f);
                      }
                      else {
                        uVar38 = ((ushort)(uVar47 >> 0xd) & 0x3ff | (ushort)((uVar35 & 0x1f) << 10))
                                 ^ 0x4000;
                        uVar50 = uVar47 >> 0xc;
                      }
                      uVar38 = uVar38 + ((uVar50 & 1) != 0);
                    }
LAB_001139ac:
                    uVar38 = uVar38 & 0x7fff;
                  }
                }
                pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar62] * lVar63
                                          + lVar63 * (iVar46 * iVar69));
                *(ushort *)(pvVar20 + lVar18 * 2) = uVar38 | (ushort)(uVar47 >> 0x10) & 0x8000;
                lVar18 = lVar18 + 1;
              }
              iVar43 = iVar43 + 1;
            }
          }
          else if (exrImage->requested_pixel_types[lVar62] == 2) {
            iVar43 = iVar15;
            for (iVar46 = 0; iVar46 != iVar54; iVar46 = iVar46 + 1) {
              lVar18 = 0;
              while( true ) {
                lVar63 = (long)exrImage->width;
                if (lVar63 <= lVar18) break;
                uVar9 = *(undefined4 *)
                         (exrImage->images[lVar62] +
                         (long)(iVar43 * exrImage->width + (int)lVar18) * 4);
                pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar62] * lVar63
                                          + lVar63 * (iVar46 * iVar69));
                *(undefined4 *)(pvVar20 + lVar18 * 4) = uVar9;
                lVar18 = lVar18 + 1;
              }
              iVar43 = iVar43 + 1;
            }
          }
        }
        else if (iVar43 == 1) {
          if (exrImage->requested_pixel_types[lVar62] == 2) {
            iVar43 = iVar15;
            for (iVar46 = 0; iVar46 != iVar54; iVar46 = iVar46 + 1) {
              lVar18 = 0;
              while( true ) {
                lVar63 = (long)exrImage->width;
                if (lVar63 <= lVar18) break;
                uVar38 = *(ushort *)
                          (exrImage->images[lVar62] +
                          (long)(iVar43 * exrImage->width + (int)lVar18) * 2);
                pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar62] * lVar63
                                          + lVar63 * (iVar46 * iVar69));
                h_01._2_2_ = 0;
                h_01.u = uVar38;
                FVar16 = anon_unknown.dwarf_13f3f::half_to_float(h_01);
                *(FP32 *)(pvVar20 + lVar18 * 4) = FVar16;
                lVar18 = lVar18 + 1;
              }
              iVar43 = iVar43 + 1;
            }
          }
          else if (exrImage->requested_pixel_types[lVar62] == 1) {
            iVar43 = iVar15;
            for (iVar46 = 0; iVar46 != iVar54; iVar46 = iVar46 + 1) {
              lVar18 = 0;
              while( true ) {
                lVar63 = (long)exrImage->width;
                if (lVar63 <= lVar18) break;
                uVar6 = *(undefined2 *)
                         (exrImage->images[lVar62] +
                         (long)(iVar43 * exrImage->width + (int)lVar18) * 2);
                pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar62] * lVar63
                                          + lVar63 * (iVar46 * iVar69));
                *(undefined2 *)(pvVar20 + lVar18 * 2) = uVar6;
                lVar18 = lVar18 + 1;
              }
              iVar43 = iVar43 + 1;
            }
          }
        }
        else if (iVar43 == 0) {
          iVar46 = iVar15;
          for (iVar43 = 0; iVar43 != iVar54; iVar43 = iVar43 + 1) {
            lVar18 = 0;
            while( true ) {
              lVar63 = (long)exrImage->width;
              if (lVar63 <= lVar18) break;
              uVar9 = *(undefined4 *)
                       (exrImage->images[lVar62] +
                       (long)(iVar46 * exrImage->width + (int)lVar18) * 4);
              pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  (&buf,channelOffsetList.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar62] * lVar63 +
                                        lVar63 * (iVar43 * iVar69));
              *(undefined4 *)(pvVar20 + lVar18 * 4) = uVar9;
              lVar18 = lVar18 + 1;
            }
            iVar46 = iVar46 + 1;
          }
        }
      }
      iVar43 = exrImage->compression;
      if (iVar43 - 2U < 2) {
        mVar23 = mz_compressBound(CONCAT44(buf.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           (int)buf.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_finish) -
                                  CONCAT44(buf.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)buf.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c,mVar23,
                   (allocator_type *)header);
        pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c,0);
        pvVar64 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        mVar23 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,mVar23,
                   (allocator_type *)&data_1);
        pvVar24 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
        pvVar25 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
        pvVar45 = pvVar64 + mVar23;
        lVar62 = 0;
        for (; pvVar64 < pvVar45; pvVar64 = pvVar64 + 2) {
          pvVar24[lVar62] = *pvVar64;
          if (pvVar45 <= pvVar64 + 1) break;
          pvVar25[lVar62 + (mVar23 + 1 >> 1)] = pvVar64[1];
          lVar62 = lVar62 + 1;
        }
        pvVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
        pvVar64 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
        vVar32 = *pvVar26;
        while (pvVar26 = pvVar26 + 1, pvVar26 < pvVar64 + mVar23) {
          vVar5 = *pvVar26;
          *pvVar26 = (vVar5 - vVar32) + 0x80;
          vVar32 = vVar5;
        }
        data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)mz_compressBound(mVar23);
        pvVar64 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
        mz_compress(pvVar20,(mz_ulong *)&data_1,pvVar64,mVar23);
        uVar9 = (int)data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        uVar40 = (ulong)data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)header);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,8,
                   (allocator_type *)&data_1);
        piVar28 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,
                                    0);
        *piVar28 = iVar15;
        pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,4);
        *(undefined4 *)pvVar20 = uVar9;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                   (dataList.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar67),
                   (const_iterator)
                   dataList.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar67].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,__first_01,__last);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                   (dataList.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar67),
                   (const_iterator)
                   dataList.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar67].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )c,(uchar *)(uVar40 + c));
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)header);
        this = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&c;
        goto LAB_0011497f;
      }
      if (iVar43 == 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,8,
                   (allocator_type *)&c);
        uVar47 = (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        piVar28 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,
                                    0);
        *piVar28 = iVar15;
        puVar29 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header
                                     ,4);
        *puVar29 = uVar47;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                   (dataList.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar67),
                   (const_iterator)
                   dataList.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar67].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,__first_01,__last);
        __first._M_current._4_4_ =
             buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_;
        __first._M_current._0_4_ =
             (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                   (dataList.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar67),
                   (const_iterator)
                   dataList.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar67].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,__first,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__first._M_current + uVar47));
        this = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)header;
        goto LAB_0011497f;
      }
      if (iVar43 == 4) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&block,(long)((double)(uint)((int)buf.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (int)buf.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) * 1.2 +
                                1024.0) & 0xffffffff,(allocator_type *)header);
        puVar21 = (ushort *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0)
        ;
        pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        iVar43 = exrImage->width;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&tmpBuffer,
                   (ulong)(CONCAT44(buf.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (int)buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish) -
                          CONCAT44(buf.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)buf.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start)) >> 1,
                   (allocator_type *)header);
        paVar60 = channels.
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
        ::vector(&channelData,
                 ((long)channels.
                        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)channels.
                       super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30,
                 (allocator_type *)
                 (((long)channels.
                         super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)channels.
                        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start) % 0x30));
        pvVar22 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        pPVar12 = channelData.
                  super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pPVar59 = channelData.
                  super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar18 = (long)channelData.
                       super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)channelData.
                       super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        piVar57 = &paVar60->pixelType;
        piVar28 = &(channelData.
                    super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size;
        lVar62 = lVar18;
        while (bVar68 = lVar62 != 0, lVar62 = lVar62 + -1, bVar68) {
          ((PIZChannelData *)(piVar28 + -7))->start = pvVar22;
          *(reference *)(piVar28 + -5) = pvVar22;
          piVar28[-3] = iVar43;
          piVar28[-2] = iVar42;
          iVar46 = *piVar57;
          *piVar28 = (iVar46 != 1) + 1;
          pvVar22 = pvVar22 + (iVar43 * iVar42 << (iVar46 != 1));
          piVar57 = piVar57 + 0xc;
          piVar28 = piVar28 + 8;
        }
        ppuVar1 = &(channelData.
                    super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start)->end;
        for (iVar42 = 0; ppuVar58 = ppuVar1, lVar62 = lVar18, iVar42 != iVar54; iVar42 = iVar42 + 1)
        {
          while (bVar68 = lVar62 != 0, lVar62 = lVar62 + -1, bVar68) {
            lVar63 = (long)*(int *)((long)ppuVar58 + 0x14) * (long)*(int *)(ppuVar58 + 1);
            memcpy(*ppuVar58,pvVar20,lVar63 * 2);
            pvVar20 = pvVar20 + lVar63 * 2;
            *ppuVar58 = *ppuVar58 + lVar63;
            ppuVar58 = ppuVar58 + 4;
          }
        }
        pvVar22 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        for (lVar62 = 0; lVar62 != 0x2000; lVar62 = lVar62 + 1) {
          bitmap[lVar62] = '\0';
        }
        uVar40 = (ulong)((long)tmpBuffer.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1;
        uVar41 = uVar40 & 0xffffffff;
        if ((int)uVar40 < 1) {
          uVar41 = 0;
        }
        for (uVar40 = 0; uVar41 != uVar40; uVar40 = uVar40 + 1) {
          bitmap[pvVar22[uVar40] >> 3] =
               bitmap[pvVar22[uVar40] >> 3] | (byte)(1 << ((byte)pvVar22[uVar40] & 7));
        }
        bitmap[0] = bitmap[0] & 0xfe;
        uVar40 = 0x1fff;
        uVar35 = 0;
        uVar47 = 0;
        uVar41 = 0;
        while( true ) {
          uVar48 = uVar40 & 0xffff;
          if (uVar41 == 0x2000) break;
          if (bitmap[uVar41] != '\0') {
            uVar40 = uVar48;
            if (uVar41 < uVar48) {
              uVar40 = uVar41 & 0xffffffff;
              uVar47 = uVar35;
            }
            if ((uVar47 & 0xffff) < uVar41) {
              uVar47 = (uint)uVar41;
              uVar35 = (uint)uVar41;
            }
          }
          uVar41 = uVar41 + 1;
        }
        uVar41 = 0;
        uVar70 = 0;
        do {
          if (uVar41 == 0) {
LAB_00113f23:
            uVar33 = uVar70;
            uVar70 = uVar70 + 1;
          }
          else {
            if (uVar41 == 0x10000) goto LAB_00113f42;
            if ((bitmap[uVar41 >> 3 & 0x1fffffff] >> ((uint)uVar41 & 7) & 1) != 0)
            goto LAB_00113f23;
            uVar33 = 0;
          }
          auStack_20038[uVar41] = uVar33;
          uVar41 = uVar41 + 1;
        } while( true );
      }
      goto LAB_00114984;
    }
    lVar62 = 1;
    for (uVar67 = 0;
        __position = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish, uVar34 != uVar67;
        uVar67 = uVar67 + 1) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
                 (const_iterator)
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )*(uchar **)
                    ((long)dataList.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar62 * 8 + -8),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(&((dataList.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start)[lVar62]);
      offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar67] = (longlong)puVar36;
      puVar36 = puVar36 + ((long)(&((dataList.
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start)[lVar62] -
                          *(long *)((long)dataList.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   lVar62 * 8 + -8));
      lVar62 = lVar62 + 3;
    }
    __first_00 = std::vector<long_long,_std::allocator<long_long>_>::at(&offsets,0);
    pvVar30 = std::vector<long_long,_std::allocator<long_long>_>::at(&offsets,0);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               (const_iterator)__position,(uchar *)__first_00,(uchar *)(pvVar30 + __n));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               (const_iterator)
               memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    __dest = (uchar *)malloc((long)memory.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)memory.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    *memory_out = __dest;
    pvVar20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&memory,0);
    __n_00 = (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    memcpy(__dest,pvVar20,__n_00);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&channelOffsetList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
    ;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&dataList);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector(&channels);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return __n_00;
LAB_00113f42:
  pvVar22 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  anon_unknown.dwarf_13f3f::applyLut
            (auStack_20038,pvVar22,
             (int)((ulong)((long)tmpBuffer.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)tmpBuffer.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 1));
  *puVar21 = (ushort)uVar40;
  puVar21[1] = (ushort)uVar35;
  __dest_00 = puVar21 + 2;
  if ((ushort)uVar40 <= (ushort)uVar35) {
    lVar62 = (uVar35 & 0xffff) - uVar48;
    memcpy(__dest_00,bitmap + uVar48,lVar62 + 1);
    __dest_00 = (ushort *)((long)__dest_00 + lVar62 + 1);
  }
  uVar38 = uVar70 - 1;
  uVar40 = 0;
  while( true ) {
    if ((ulong)((long)pPVar12 - (long)pPVar59 >> 5) <= uVar40) break;
    pPVar59 = pPVar59 + uVar40;
    lVar62 = 0;
    for (lVar18 = 0; iVar42 = pPVar59->size, lVar18 < iVar42; lVar18 = lVar18 + 1) {
      puVar11 = pPVar59->start;
      uVar47 = pPVar59->nx;
      uVar35 = pPVar59->ny;
      iVar54 = uVar47 * iVar42;
      uVar44 = uVar35;
      if ((int)uVar47 < (int)uVar35) {
        uVar44 = uVar47;
      }
      uVar50 = 1;
      for (uVar17 = 2; (int)uVar17 <= (int)uVar44; uVar17 = uVar17 * 2) {
        iVar43 = (uVar47 - uVar17) * iVar42;
        lVar63 = (long)(int)(uVar50 * iVar42);
        lVar55 = (long)(int)(uVar50 * iVar54);
        for (puVar66 = (ushort *)((long)puVar11 + lVar62);
            puVar66 <= puVar11 + lVar18 + (int)((uVar35 - uVar17) * iVar54);
            puVar66 = puVar66 + (int)(uVar17 * iVar54)) {
          for (puVar65 = puVar66; puVar65 <= puVar66 + iVar43;
              puVar65 = puVar65 + (int)(uVar17 * iVar42)) {
            h = puVar65 + lVar55;
            h_00 = puVar65 + lVar55 + lVar63;
            uVar7 = *puVar65;
            uVar8 = puVar65[lVar63];
            if (uVar38 < 0x4000) {
              sVar49 = *h - *h_00;
              uVar52 = (int)(short)*h_00 + (int)(short)*h;
              *puVar65 = (unsigned_short)
                         ((uint)(((int)uVar52 >> 1) + ((int)(short)uVar8 + (int)(short)uVar7 >> 1))
                         >> 1);
              *h = (short)((uint)((int)(short)uVar8 + (int)(short)uVar7) >> 1) -
                   (short)(uVar52 >> 1);
              puVar65[lVar63] =
                   (unsigned_short)((uint)((int)sVar49 + (int)(short)(uVar7 - uVar8)) >> 1);
              *h_00 = (uVar7 - uVar8) - sVar49;
            }
            else {
              iVar46 = (uVar7 ^ 0x8000) - (uint)uVar8;
              uVar52 = (*h ^ 0x8000) - (uint)*h_00 & 0x8000ffff;
              anon_unknown.dwarf_13f3f::wenc16
                        ((ushort)((uint)iVar46 >> 0x10) & 0x8000 ^
                         (ushort)((uint)uVar8 + (uVar7 ^ 0x8000) >> 1),
                         (ushort)(uVar52 >> 0x10) ^ (ushort)((*h ^ 0x8000) + (uint)*h_00 >> 1),
                         puVar65,h);
              anon_unknown.dwarf_13f3f::wenc16
                        ((unsigned_short)iVar46,(unsigned_short)uVar52,puVar65 + lVar63,h_00);
            }
          }
          if ((uVar47 & uVar50) != 0) {
            uVar7 = *puVar65;
            uVar8 = puVar65[lVar55];
            if (uVar38 < 0x4000) {
              uVar39 = (ushort)((uint)((int)(short)uVar8 + (int)(short)uVar7) >> 1);
              iVar46 = (int)(short)uVar7 - (int)(short)uVar8;
            }
            else {
              iVar46 = (uVar7 ^ 0x8000) - (uint)uVar8;
              uVar39 = (ushort)((uint)iVar46 >> 0x10) & 0x8000 ^
                       (ushort)((uVar7 ^ 0x8000) + (uint)uVar8 >> 1);
            }
            puVar65[lVar55] = (unsigned_short)iVar46;
            *puVar65 = uVar39;
          }
        }
        if ((uVar35 & uVar50) != 0) {
          puVar65 = puVar66 + iVar43;
          for (; puVar66 <= puVar65; puVar66 = puVar66 + (int)(uVar17 * iVar42)) {
            uVar7 = *puVar66;
            uVar8 = puVar66[lVar63];
            if (uVar38 < 0x4000) {
              uVar39 = (ushort)((uint)((int)(short)uVar8 + (int)(short)uVar7) >> 1);
              iVar43 = (int)(short)uVar7 - (int)(short)uVar8;
            }
            else {
              iVar43 = (uVar7 ^ 0x8000) - (uint)uVar8;
              uVar39 = (ushort)((uint)iVar43 >> 0x10) & 0x8000 ^
                       (ushort)((uVar7 ^ 0x8000) + (uint)uVar8 >> 1);
            }
            puVar66[lVar63] = (ushort)iVar43;
            *puVar66 = uVar39;
          }
        }
        uVar50 = uVar17;
      }
      lVar62 = lVar62 + 2;
    }
    uVar40 = uVar40 + 1;
    pPVar59 = channelData.
              super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  __dest_00[0] = 0;
  __dest_00[1] = 0;
  pvVar22 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  iVar54 = (int)__dest_00 + 4;
  uVar40 = (ulong)((long)tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)tmpBuffer.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 1;
  iVar42 = (int)uVar40;
  if (iVar42 == 0) {
    iVar42 = 0;
  }
  else {
    for (lVar62 = 0; lVar62 != 0x10001; lVar62 = lVar62 + 1) {
      (&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start)[lVar62] = (pointer)0x0;
    }
    uVar41 = 0;
    if (0 < iVar42) {
      uVar41 = uVar40 & 0xffffffff;
    }
    for (uVar40 = 0; uVar41 != uVar40; uVar40 = uVar40 + 1) {
      ppuVar14 = &data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + pvVar22[uVar40];
      *ppuVar14 = *ppuVar14 + 1;
    }
    p_Var53 = (_Iter_comp_val<(anonymous_namespace)::FHeapCompare> *)0xffffffffffffffff;
    ppuVar14 = (pointer *)&data_1;
    do {
      ppuVar27 = ppuVar14;
      ppuVar2 = &data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + (long)p_Var53;
      p_Var53 = p_Var53 + 1;
      ppuVar14 = ppuVar27 + 1;
    } while (*ppuVar2 == (pointer)0x0);
    uVar40 = 0;
    iVar43 = 0;
    for (p_Var37 = p_Var53; p_Var37 < (_Iter_comp_val<(anonymous_namespace)::FHeapCompare> *)0x10001
        ; p_Var37 = p_Var37 + 1) {
      hlink[(long)p_Var37] = (int)p_Var37;
      if (*ppuVar27 != (pointer)0x0) {
        *(pointer **)(header + (long)iVar43 * 8) = ppuVar27;
        iVar43 = iVar43 + 1;
        uVar40 = (ulong)p_Var37 & 0xffffffff;
      }
      ppuVar27 = ppuVar27 + 1;
    }
    ppuVar14 = &data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + (int)uVar40;
    *ppuVar14 = (pointer)0x1;
    *(pointer **)(header + (long)iVar43 * 8) = ppuVar14;
    uVar47 = iVar43 + 1;
    p_Var37 = p_Var53;
    if (0 < iVar43) {
      uVar41 = (long)(int)uVar47 - 2U >> 1;
      do {
        std::
        __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FHeapCompare>>
                  (header,uVar41,(long)(int)uVar47,*(undefined8 *)(header + uVar41 * 8));
        bVar68 = uVar41 != 0;
        uVar41 = uVar41 - 1;
      } while (bVar68);
    }
    lVar62 = (long)(int)uVar40 + 1;
    memset(&c,0,0x80008);
    uVar40 = (ulong)uVar47;
    while( true ) {
      if ((int)uVar40 < 2) break;
      uVar61 = (long)__first_01._M_current - (long)&data_1;
      std::pop_heap<long_long**,(anonymous_namespace)::FHeapCompare>(header,header + uVar40 * 8);
      uVar41 = uVar40 - 1;
      uVar48 = (ulong)((long)__first_01._M_current - (long)&data_1) >> 3;
      std::pop_heap<long_long**,(anonymous_namespace)::FHeapCompare>
                (header,header + uVar40 * 8 + -8);
      uVar61 = uVar61 >> 3;
      ppuVar2 = &data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)uVar48;
      *ppuVar2 = *ppuVar2 +
                 (long)(&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start)[(int)uVar61];
      std::
      __push_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_val<(anonymous_namespace)::FHeapCompare>>
                ((longlong **)header,uVar40 - 2,0,*(longlong **)(header + uVar40 * 8 + -0x10),
                 p_Var37);
      do {
        uVar47 = (uint)uVar48;
        (&c)[(int)uVar47] = (&c)[(int)uVar47] + 1;
        uVar48 = (ulong)(uint)hlink[(int)uVar47];
      } while (hlink[(int)uVar47] != uVar47);
      hlink[(int)uVar47] = (int)uVar61;
      do {
        uVar47 = (uint)uVar61;
        (&c)[(int)uVar47] = (&c)[(int)uVar47] + 1;
        uVar61 = (ulong)(uint)hlink[(int)uVar47];
        uVar40 = uVar41;
      } while (hlink[(int)uVar47] != uVar47);
    }
    anon_unknown.dwarf_13f3f::hufCanonicalCodeTable(&c);
    memcpy(&data_1,&c,0x80008);
    c = 0;
    uVar40 = (ulong)p_Var53 & 0xffffffff;
    __first_01._M_current = (uchar *)(__dest_00 + 0xc);
    while (_Var13._M_p = (pointer)__first_01._M_current, uVar47 = (uint)uVar40,
          (int)uVar47 <= (int)lVar62) {
      uVar41 = (ulong)(int)uVar47;
      uVar40 = (ulong)(&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start)[uVar41] & 0x3f;
      if (uVar40 == 0) {
        uVar48 = 0x3a;
        uVar61 = 0xfffffffb;
        while( true ) {
          uVar47 = (int)uVar61 + 6;
          if (((lVar62 <= (long)uVar41) || (0x104 < uVar47)) ||
             (((ulong)(&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish)[uVar41] & 0x3f) != 0)) break;
          uVar41 = uVar41 + 1;
          uVar61 = (ulong)((int)uVar61 + 1);
          uVar48 = uVar48 + 1;
        }
        if (uVar47 < 2) {
          uVar47 = (uint)uVar41;
          goto LAB_0011469a;
        }
        iVar43 = 6;
        if (5 < uVar47) {
          anon_unknown.dwarf_13f3f::outputBits(6,0x3f,&c,hlink,(char **)header);
          iVar43 = 8;
          uVar48 = uVar61;
        }
        anon_unknown.dwarf_13f3f::outputBits(iVar43,uVar48,&c,hlink,(char **)header);
      }
      else {
LAB_0011469a:
        anon_unknown.dwarf_13f3f::outputBits(6,uVar40,&c,hlink,(char **)header);
        uVar41 = (ulong)uVar47;
      }
      uVar40 = (ulong)((int)uVar41 + 1);
    }
    c = 0;
    iVar43 = 0;
    lVar18 = 1;
    while( true ) {
      uVar38 = pvVar22[lVar18 + -1];
      if (iVar42 <= lVar18) break;
      if (iVar43 < 0xff && uVar38 == pvVar22[lVar18]) {
        iVar43 = iVar43 + 1;
      }
      else {
        anon_unknown.dwarf_13f3f::sendCode
                  ((longlong)
                   (&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)[uVar38],iVar43,(longlong)*ppuVar14,&c
                   ,hlink,(char **)header);
        iVar43 = 0;
      }
      lVar18 = lVar18 + 1;
    }
    anon_unknown.dwarf_13f3f::sendCode
              ((longlong)
               (&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start)[uVar38],iVar43,(longlong)*ppuVar14,&c,hlink,
               (char **)header);
    iVar46 = (int)_Var13._M_p;
    iVar43 = (int)__first_01._M_current - iVar46;
    *(value_type *)(__dest_00 + 2) = (value_type)p_Var53;
    *(value_type *)((long)__dest_00 + 5) = (value_type)((ulong)p_Var53 >> 8);
    *(value_type *)(__dest_00 + 3) = (value_type)((ulong)p_Var53 >> 0x10);
    *(value_type *)((long)__dest_00 + 7) = (value_type)((ulong)p_Var53 >> 0x18);
    *(value_type *)(__dest_00 + 4) = (value_type)lVar62;
    *(value_type *)((long)__dest_00 + 9) = (value_type)((ulong)lVar62 >> 8);
    *(value_type *)(__dest_00 + 5) = (value_type)((ulong)lVar62 >> 0x10);
    *(value_type *)((long)__dest_00 + 0xb) = (value_type)((ulong)lVar62 >> 0x18);
    lVar62 = (long)_Var13._M_p - (long)(__dest_00 + 0xc);
    *(value_type *)(__dest_00 + 6) = (value_type)lVar62;
    *(value_type *)((long)__dest_00 + 0xd) = (value_type)((ulong)lVar62 >> 8);
    *(value_type *)(__dest_00 + 7) = (value_type)((ulong)lVar62 >> 0x10);
    *(value_type *)((long)__dest_00 + 0xf) = (value_type)((ulong)lVar62 >> 0x18);
    iVar42 = iVar43 * 8;
    *(value_type *)(__dest_00 + 8) = (value_type)iVar42;
    *(value_type *)((long)__dest_00 + 0x11) = (value_type)((uint)iVar42 >> 8);
    *(value_type *)(__dest_00 + 9) = (value_type)((uint)iVar42 >> 0x10);
    *(value_type *)((long)__dest_00 + 0x13) = (value_type)((uint)iVar42 >> 0x18);
    iVar42 = ((iVar43 * 8 + 7) / 8 + iVar46) - iVar54;
    __dest_00[10] = 0;
    __dest_00[0xb] = 0;
  }
  *(int *)__dest_00 = iVar42;
  std::
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  ::~vector(&channelData);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,8,(allocator_type *)&c)
  ;
  piVar28 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
  *piVar28 = iVar15;
  puVar29 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,4);
  uVar47 = iVar42 + (iVar54 - (int)puVar21);
  *puVar29 = uVar47;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             (dataList.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar67),
             (const_iterator)
             dataList.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar67].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,__first_01,__last);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             (dataList.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar67),
             (const_iterator)
             dataList.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar67].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + uVar47));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)header);
  this = &block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
LAB_0011497f:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this);
LAB_00114984:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  uVar67 = uVar67 + 1;
  goto LAB_001135ce;
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL || exrImage->compression < 0 ||
      exrImage->compression > TINYEXR_COMPRESSIONTYPE_PIZ) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return 0;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlines = 1;
  if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIP) {
    numScanlines = 16;
  } else if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_PIZ) {
    numScanlines = 32;
  }

  // Write attributes.
  std::vector<ChannelInfo> channels;
  {
    std::vector<unsigned char> data;

    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int comp = exrImage->compression;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&comp));
    }
    WriteAttributeToMemory(memory, "compression", "compression",
                           reinterpret_cast<const unsigned char *>(&comp), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name,
                             exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(
                                 &exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlines;
  if (numBlocks * numScanlines < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlines * i;
    int endY = (std::min)(numScanlines * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_NONE) {

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(uncompressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = (unsigned int)buf.size();
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), buf.begin(), buf.begin() + dataLen);

    } else if ((exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
               (exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIP)) {

      std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
      unsigned long long outSize = block.size();

      CompressZip(&block.at(0), outSize,
                  reinterpret_cast<const unsigned char *>(&buf.at(0)),
                  buf.size());

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(compressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = outSize; // truncate
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), block.begin(),
                         block.begin() + dataLen);

    } else if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_PIZ) {
      unsigned int bufLen =
          1024 +
          1.2 * (unsigned int)buf.size(); // @fixme { compute good bound. }
      std::vector<unsigned char> block(bufLen);
      unsigned int outSize = static_cast<unsigned int>(block.size());

      CompressPiz(&block.at(0), outSize,
                  reinterpret_cast<const unsigned char *>(&buf.at(0)),
                  buf.size(), channels, exrImage->width, h);

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(compressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = outSize;
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), block.begin(),
                         block.begin() + dataLen);

    } else {
      assert(0);
    }

  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}